

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall Search::search::set_options(search *this,uint32_t opts)

{
  ostream *poVar1;
  search_private *psVar2;
  vw_exception *this_00;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  psVar2 = this->priv;
  if ((psVar2->all->vw_is_main == true) && (psVar2->state != INITIALIZE)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "warning: task should not set options except in initialize function!");
    std::endl<char,std::char_traits<char>>(poVar1);
    psVar2 = this->priv;
  }
  if ((AUTO_CONDITION_FEATURES & opts) != 0) {
    psVar2->auto_condition_features = true;
    psVar2 = this->priv;
  }
  if ((AUTO_HAMMING_LOSS & opts) != 0) {
    psVar2->auto_hamming_loss = true;
    psVar2 = this->priv;
  }
  if ((EXAMPLES_DONT_CHANGE & opts) != 0) {
    psVar2->examples_dont_change = true;
    psVar2 = this->priv;
  }
  if ((IS_LDF & opts) != 0) {
    psVar2->is_ldf = true;
    psVar2 = this->priv;
  }
  if ((NO_CACHING & opts) != 0) {
    psVar2->no_caching = true;
    psVar2 = this->priv;
  }
  if ((ACTION_COSTS & opts) != 0) {
    psVar2->use_action_costs = true;
    psVar2 = this->priv;
  }
  if ((psVar2->is_ldf == true) && ((psVar2->use_action_costs & 1U) != 0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_190,
                    "using LDF and actions costs is not yet implemented; turn off action costs");
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xbee,&local_1c0);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (((psVar2->use_action_costs & 1U) != 0) && (psVar2->rollout_method != NO_ROLLOUT)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void search::set_options(uint32_t opts)
{
  if (this->priv->all->vw_is_main && (this->priv->state != INITIALIZE))
    std::cerr << "warning: task should not set options except in initialize function!" << endl;
  if ((opts & AUTO_CONDITION_FEATURES) != 0)
    this->priv->auto_condition_features = true;
  if ((opts & AUTO_HAMMING_LOSS) != 0)
    this->priv->auto_hamming_loss = true;
  if ((opts & EXAMPLES_DONT_CHANGE) != 0)
    this->priv->examples_dont_change = true;
  if ((opts & IS_LDF) != 0)
    this->priv->is_ldf = true;
  if ((opts & NO_CACHING) != 0)
    this->priv->no_caching = true;
  if ((opts & ACTION_COSTS) != 0)
    this->priv->use_action_costs = true;

  if (this->priv->is_ldf && this->priv->use_action_costs)
    THROW("using LDF and actions costs is not yet implemented; turn off action costs");  // TODO fix

  if (this->priv->use_action_costs && (this->priv->rollout_method != NO_ROLLOUT))
    std::cerr
        << "warning: task is designed to use rollout costs, but this only works when --search_rollout none is specified"
        << endl;
}